

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vsx-impl.inc.c
# Opt level: O0

void gen_mtvsrdd(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *tcg_ctx_00;
  uint32_t uVar1;
  TCGv_i64 ret;
  TCGv_i64 t0;
  TCGContext_conflict10 *tcg_ctx;
  DisasContext_conflict10 *ctx_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  uVar1 = xT(ctx->opcode);
  if (uVar1 < 0x20) {
    if (((ctx->vsx_enabled ^ 0xffU) & 1) != 0) {
      gen_exception(ctx,0x5e);
      return;
    }
  }
  else if (((ctx->altivec_enabled ^ 0xffU) & 1) != 0) {
    gen_exception(ctx,0x49);
    return;
  }
  ret = tcg_temp_new_i64(tcg_ctx_00);
  uVar1 = rA(ctx->opcode);
  if (uVar1 == 0) {
    tcg_gen_movi_i64_ppc64(tcg_ctx_00,ret,0);
  }
  else {
    uVar1 = rA(ctx->opcode);
    tcg_gen_mov_i64_ppc64(tcg_ctx_00,ret,cpu_gpr[uVar1]);
  }
  uVar1 = xT(ctx->opcode);
  set_cpu_vsrh(tcg_ctx_00,uVar1,ret);
  uVar1 = rB(ctx->opcode);
  tcg_gen_mov_i64_ppc64(tcg_ctx_00,ret,cpu_gpr[uVar1]);
  uVar1 = xT(ctx->opcode);
  set_cpu_vsrl(tcg_ctx_00,uVar1,ret);
  tcg_temp_free_i64(tcg_ctx_00,ret);
  return;
}

Assistant:

static void gen_mtvsrdd(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv_i64 t0;
    if (xT(ctx->opcode) < 32) {
        if (unlikely(!ctx->vsx_enabled)) {
            gen_exception(ctx, POWERPC_EXCP_VSXU);
            return;
        }
    } else {
        if (unlikely(!ctx->altivec_enabled)) {
            gen_exception(ctx, POWERPC_EXCP_VPU);
            return;
        }
    }

    t0 = tcg_temp_new_i64(tcg_ctx);
    if (!rA(ctx->opcode)) {
        tcg_gen_movi_i64(tcg_ctx, t0, 0);
    } else {
        tcg_gen_mov_i64(tcg_ctx, t0, cpu_gpr[rA(ctx->opcode)]);
    }
    set_cpu_vsrh(tcg_ctx, xT(ctx->opcode), t0);

    tcg_gen_mov_i64(tcg_ctx, t0, cpu_gpr[rB(ctx->opcode)]);
    set_cpu_vsrl(tcg_ctx, xT(ctx->opcode), t0);
    tcg_temp_free_i64(tcg_ctx, t0);
}